

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::Blend(glcts *this,Vec4 *rgb,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float s;
  float s_00;
  Vec4 VVar4;
  Vec4 rgbOut;
  undefined8 local_78;
  undefined4 local_70;
  tcu local_68 [16];
  tcu local_58 [16];
  tcu local_48 [16];
  tcu local_38 [16];
  
  fVar1 = src->m_data[3];
  fVar2 = dst->m_data[3];
  s_00 = (1.0 - fVar2) * fVar1;
  s = (1.0 - fVar1) * fVar2;
  fVar3 = fVar1 * fVar2 + s_00 + s;
  tcu::operator*(local_48,fVar1 * fVar2,rgb);
  tcu::operator*(local_58,s_00,src);
  tcu::operator+(local_38,(Vector<float,_4> *)local_48,(Vector<float,_4> *)local_58);
  tcu::operator*(local_68,s,dst);
  tcu::operator+((tcu *)&local_78,(Vector<float,_4> *)local_38,(Vector<float,_4> *)local_68);
  *(undefined8 *)this = local_78;
  *(undefined4 *)(this + 8) = local_70;
  VVar4.m_data[1] = 0.0;
  VVar4.m_data[0] = fVar3;
  *(float *)(this + 0xc) = fVar3;
  VVar4.m_data[2] = (float)(undefined4)local_78;
  VVar4.m_data[3] = (float)local_78._4_4_;
  return (Vec4)VVar4.m_data;
}

Assistant:

static tcu::Vec4 Blend(const tcu::Vec4& rgb, const tcu::Vec4& src, const tcu::Vec4& dst)
{
	float	 p[3]   = { GetP0(src, dst), GetP1(src, dst), GetP2(src, dst) };
	float	 alpha  = p[0] + p[1] + p[2];
	tcu::Vec4 rgbOut = (p[0] * rgb) + (p[1] * src) + (p[2] * dst);
	return tcu::Vec4(rgbOut[0], rgbOut[1], rgbOut[2], alpha);
}